

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_entry.c
# Opt level: O2

archive_entry * archive_entry_clone(archive_entry *entry)

{
  unsigned_long uVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  archive_entry *entry_00;
  ae_sparse *paVar9;
  ae_xattr *paVar10;
  
  entry_00 = archive_entry_new2(entry->archive);
  if (entry_00 != (archive_entry *)0x0) {
    memcpy(&entry_00->ae_stat,&entry->ae_stat,0xa8);
    uVar1 = entry->ae_fflags_clear;
    entry_00->ae_fflags_set = entry->ae_fflags_set;
    entry_00->ae_fflags_clear = uVar1;
    archive_mstring_copy(&entry_00->ae_fflags_text,&entry->ae_fflags_text);
    archive_mstring_copy(&entry_00->ae_gname,&entry->ae_gname);
    archive_mstring_copy(&entry_00->ae_hardlink,&entry->ae_hardlink);
    archive_mstring_copy(&entry_00->ae_pathname,&entry->ae_pathname);
    archive_mstring_copy(&entry_00->ae_sourcepath,&entry->ae_sourcepath);
    archive_mstring_copy(&entry_00->ae_symlink,&entry->ae_symlink);
    entry_00->ae_set = entry->ae_set;
    archive_mstring_copy(&entry_00->ae_uname,&entry->ae_uname);
    entry_00->ae_symlink_type = entry->ae_symlink_type;
    entry_00->encryption = entry->encryption;
    uVar2 = *(undefined8 *)((entry->digest).md5 + 8);
    *(undefined8 *)(entry_00->digest).md5 = *(undefined8 *)(entry->digest).md5;
    *(undefined8 *)((entry_00->digest).md5 + 8) = uVar2;
    *(undefined4 *)((entry_00->digest).rmd160 + 0x10) =
         *(undefined4 *)((entry->digest).rmd160 + 0x10);
    uVar2 = *(undefined8 *)((entry->digest).rmd160 + 8);
    *(undefined8 *)(entry_00->digest).rmd160 = *(undefined8 *)(entry->digest).rmd160;
    *(undefined8 *)((entry_00->digest).rmd160 + 8) = uVar2;
    *(undefined4 *)((entry_00->digest).sha1 + 0x10) = *(undefined4 *)((entry->digest).sha1 + 0x10);
    uVar2 = *(undefined8 *)((entry->digest).sha1 + 8);
    *(undefined8 *)(entry_00->digest).sha1 = *(undefined8 *)(entry->digest).sha1;
    *(undefined8 *)((entry_00->digest).sha1 + 8) = uVar2;
    uVar2 = *(undefined8 *)(entry->digest).sha256;
    uVar3 = *(undefined8 *)((entry->digest).sha256 + 8);
    uVar4 = *(undefined8 *)((entry->digest).sha256 + 0x18);
    *(undefined8 *)((entry_00->digest).sha256 + 0x10) =
         *(undefined8 *)((entry->digest).sha256 + 0x10);
    *(undefined8 *)((entry_00->digest).sha256 + 0x18) = uVar4;
    *(undefined8 *)(entry_00->digest).sha256 = uVar2;
    *(undefined8 *)((entry_00->digest).sha256 + 8) = uVar3;
    uVar2 = *(undefined8 *)((entry->digest).sha384 + 8);
    uVar3 = *(undefined8 *)((entry->digest).sha384 + 0x10);
    uVar4 = *(undefined8 *)((entry->digest).sha384 + 0x18);
    uVar5 = *(undefined8 *)((entry->digest).sha384 + 0x20);
    uVar6 = *(undefined8 *)((entry->digest).sha384 + 0x28);
    *(undefined8 *)(entry_00->digest).sha384 = *(undefined8 *)(entry->digest).sha384;
    *(undefined8 *)((entry_00->digest).sha384 + 8) = uVar2;
    *(undefined8 *)((entry_00->digest).sha384 + 0x10) = uVar3;
    *(undefined8 *)((entry_00->digest).sha384 + 0x18) = uVar4;
    *(undefined8 *)((entry_00->digest).sha384 + 0x20) = uVar5;
    *(undefined8 *)((entry_00->digest).sha384 + 0x28) = uVar6;
    uVar2 = *(undefined8 *)((entry->digest).sha512 + 8);
    uVar3 = *(undefined8 *)((entry->digest).sha512 + 0x10);
    uVar4 = *(undefined8 *)((entry->digest).sha512 + 0x18);
    uVar5 = *(undefined8 *)((entry->digest).sha512 + 0x20);
    uVar6 = *(undefined8 *)((entry->digest).sha512 + 0x28);
    uVar7 = *(undefined8 *)((entry->digest).sha512 + 0x30);
    uVar8 = *(undefined8 *)((entry->digest).sha512 + 0x38);
    *(undefined8 *)(entry_00->digest).sha512 = *(undefined8 *)(entry->digest).sha512;
    *(undefined8 *)((entry_00->digest).sha512 + 8) = uVar2;
    *(undefined8 *)((entry_00->digest).sha512 + 0x10) = uVar3;
    *(undefined8 *)((entry_00->digest).sha512 + 0x18) = uVar4;
    *(undefined8 *)((entry_00->digest).sha512 + 0x20) = uVar5;
    *(undefined8 *)((entry_00->digest).sha512 + 0x28) = uVar6;
    *(undefined8 *)((entry_00->digest).sha512 + 0x30) = uVar7;
    *(undefined8 *)((entry_00->digest).sha512 + 0x38) = uVar8;
    archive_acl_copy(&entry_00->acl,&entry->acl);
    archive_entry_copy_mac_metadata(entry_00,entry->mac_metadata,entry->mac_metadata_size);
    paVar10 = (ae_xattr *)&entry->xattr_head;
    while (paVar10 = paVar10->next, paVar10 != (ae_xattr *)0x0) {
      archive_entry_xattr_add_entry(entry_00,paVar10->name,paVar10->value,paVar10->size);
    }
    paVar9 = (ae_sparse *)&entry->sparse_head;
    while (paVar9 = paVar9->next, paVar9 != (ae_sparse *)0x0) {
      archive_entry_sparse_add_entry(entry_00,paVar9->offset,paVar9->length);
    }
  }
  return entry_00;
}

Assistant:

struct archive_entry *
archive_entry_clone(struct archive_entry *entry)
{
	struct archive_entry *entry2;
	struct ae_xattr *xp;
	struct ae_sparse *sp;
	size_t s;
	const void *p;

	/* Allocate new structure and copy over all of the fields. */
	/* TODO: Should we copy the archive over?  Or require a new archive
	 * as an argument? */
	entry2 = archive_entry_new2(entry->archive);
	if (entry2 == NULL)
		return (NULL);
	entry2->ae_stat = entry->ae_stat;
	entry2->ae_fflags_set = entry->ae_fflags_set;
	entry2->ae_fflags_clear = entry->ae_fflags_clear;

	/* TODO: XXX If clone can have a different archive, what do we do here if
	 * character sets are different? XXX */
	archive_mstring_copy(&entry2->ae_fflags_text, &entry->ae_fflags_text);
	archive_mstring_copy(&entry2->ae_gname, &entry->ae_gname);
	archive_mstring_copy(&entry2->ae_hardlink, &entry->ae_hardlink);
	archive_mstring_copy(&entry2->ae_pathname, &entry->ae_pathname);
	archive_mstring_copy(&entry2->ae_sourcepath, &entry->ae_sourcepath);
	archive_mstring_copy(&entry2->ae_symlink, &entry->ae_symlink);
	entry2->ae_set = entry->ae_set;
	archive_mstring_copy(&entry2->ae_uname, &entry->ae_uname);

	/* Copy symlink type */
	entry2->ae_symlink_type = entry->ae_symlink_type;

	/* Copy encryption status */
	entry2->encryption = entry->encryption;

	/* Copy digests */
#define copy_digest(_e2, _e, _t) \
	memcpy(_e2->digest._t, _e->digest._t, sizeof(_e2->digest._t))

	copy_digest(entry2, entry, md5);
	copy_digest(entry2, entry, rmd160);
	copy_digest(entry2, entry, sha1);
	copy_digest(entry2, entry, sha256);
	copy_digest(entry2, entry, sha384);
	copy_digest(entry2, entry, sha512);

#undef copy_digest
	
	/* Copy ACL data over. */
	archive_acl_copy(&entry2->acl, &entry->acl);

	/* Copy Mac OS metadata. */
	p = archive_entry_mac_metadata(entry, &s);
	archive_entry_copy_mac_metadata(entry2, p, s);

	/* Copy xattr data over. */
	xp = entry->xattr_head;
	while (xp != NULL) {
		archive_entry_xattr_add_entry(entry2,
		    xp->name, xp->value, xp->size);
		xp = xp->next;
	}

	/* Copy sparse data over. */
	sp = entry->sparse_head;
	while (sp != NULL) {
		archive_entry_sparse_add_entry(entry2,
		    sp->offset, sp->length);
		sp = sp->next;
	}

	return (entry2);
}